

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O2

string * __thiscall
bssl::CertErrors::ToDebugString_abi_cxx11_(string *__return_storage_ptr__,CertErrors *this)

{
  pointer pCVar1;
  pointer this_00;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pCVar1 = (this->nodes_).super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->nodes_).
                 super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1) {
    CertError::ToDebugString_abi_cxx11_(&local_40,this_00);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CertErrors::ToDebugString() const {
  std::string result;
  for (const CertError &node : nodes_) {
    result += node.ToDebugString();
  }

  return result;
}